

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::sgd::eval(sgd *this,vec3 *wi,vec3 *wo,void *param_3)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  impl *piVar1;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  float fVar3;
  vec3 vVar4;
  value_type vVar5;
  float_t local_1f8;
  float local_1f4;
  _BinBase<std::__multiplies,_std::valarray<float>,_std::valarray<float>_> local_1f0;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_Expr,_std::_ValArray,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_ValArray,_float,_float>,_float>,_float>
  local_1e0;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Expr,_std::_ValArray,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_ValArray,_float,_float>,_float>_>,_float>
  local_1c8;
  _Expr<std::__detail::_BinClos<std::__divides,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Expr,_std::_ValArray,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_ValArray,_float,_float>,_float>_>,_float>,_float>
  local_1a8;
  _Expr<std::__detail::_BinClos<std::__plus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__divides,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Expr,_std::_ValArray,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_ValArray,_float,_float>,_float>_>,_float>_>,_float>
  local_180;
  _Expr<std::__detail::_BinClos<std::__divides,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__plus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__divides,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Expr,_std::_ValArray,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_ValArray,_float,_float>,_float>_>,_float>_>,_float>,_float>
  local_150;
  undefined1 local_118 [8];
  value_type D;
  value_type G;
  undefined1 local_f0 [8];
  value_type F;
  float local_cc;
  float local_c8;
  float local_c4;
  iterator local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  value_type Kd;
  undefined1 local_80 [8];
  value_type Ks;
  float_t local_68;
  vec3 local_60;
  vec3 local_50;
  float *local_40;
  vec3 wh;
  void *param_3_local;
  vec3 *wo_local;
  vec3 *wi_local;
  sgd *this_local;
  
  if ((wo->z <= 0.0) || (*(float *)((long)param_3 + 8) <= 0.0)) {
    (**(code **)(*(long *)wi + 0x10))(this);
    pfVar2 = extraout_RDX_00;
  }
  else {
    vVar4 = djb::operator+(wo,(vec3 *)param_3);
    local_60.z = vVar4.z;
    local_50.z = local_60.z;
    local_60._0_8_ = vVar4._0_8_;
    local_50.x = local_60.x;
    local_50.y = local_60.y;
    join_0x00001240_0x00001200_ = normalize(&local_50);
    wh.x = local_68;
    local_40 = Ks._M_data;
    Kd._M_data._4_4_ = (float)*(double *)(*(long *)&wi[1].y + 0x28);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)((long)&Kd._M_data + 4);
    std::valarray<float>::valarray((valarray<float> *)local_80,__l_00);
    local_cc = (float)*(double *)(*(long *)&wi[1].y + 0x10);
    local_c8 = (float)*(double *)(*(long *)&wi[1].y + 0x18);
    local_c4 = (float)*(double *)(*(long *)&wi[1].y + 0x20);
    local_c0 = &local_cc;
    local_b8 = 3;
    __l._M_len = 3;
    __l._M_array = local_c0;
    std::valarray<float>::valarray((valarray<float> *)local_b0,__l);
    piVar1 = fresnel::ptr::operator->((ptr *)&wi->z);
    G._M_data._4_4_ = dot(wo,(vec3 *)&local_40);
    fVar3 = sat<float>((float *)((long)&G._M_data + 4));
    (*piVar1->_vptr_impl[4])((ulong)(uint)fVar3,local_f0);
    gaf((sgd *)&D._M_data,wi,(vec3 *)&local_40,wo);
    ndf((sgd *)local_118,wi);
    local_1f0 = (_BinBase<std::__multiplies,_std::valarray<float>,_std::valarray<float>_>)
                std::operator*((valarray<float> *)local_f0,(valarray<float> *)local_118);
    std::operator*(&local_1e0,
                   (_Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_ValArray,_float,_float>,_float>
                    *)&local_1f0,(valarray<float> *)&D._M_data);
    std::operator*(&local_1c8,(valarray<float> *)local_80,&local_1e0);
    local_1f4 = wo->z * *(float *)((long)param_3 + 8);
    std::operator/(&local_1a8,&local_1c8,&local_1f4);
    std::operator+(&local_180,(valarray<float> *)local_b0,&local_1a8);
    local_1f8 = m_pi();
    std::operator/(&local_150,&local_180,&local_1f8);
    std::valarray<float>::
    valarray<std::__detail::_BinClos<std::__divides,std::_Expr,std::_Constant,std::__detail::_BinClos<std::__plus,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__divides,std::_Expr,std::_Constant,std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__multiplies,std::_Expr,std::_ValArray,std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_ValArray,float,float>,float>>,float>>,float>>
              ((valarray<float> *)this,&local_150);
    std::valarray<float>::~valarray((valarray<float> *)local_118);
    std::valarray<float>::~valarray((valarray<float> *)&D._M_data);
    std::valarray<float>::~valarray((valarray<float> *)local_f0);
    std::valarray<float>::~valarray((valarray<float> *)local_b0);
    std::valarray<float>::~valarray((valarray<float> *)local_80);
    pfVar2 = extraout_RDX;
  }
  vVar5._M_data = pfVar2;
  vVar5._M_size = (size_t)this;
  return vVar5;
}

Assistant:

brdf::value_type
sgd::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	if (wi.z > 0 && wo.z > 0) {
		vec3 wh = normalize(wi + wo);
		const brdf::value_type Ks = {
		    (float_t)m_data->rhoS[0],
		    (float_t)m_data->rhoS[1],
		    (float_t)m_data->rhoS[2]
		};
		const brdf::value_type Kd = {
		    (float_t)m_data->rhoD[0],
		    (float_t)m_data->rhoD[1],
		    (float_t)m_data->rhoD[2]
		};
		brdf::value_type F = m_fresnel->eval(sat(dot(wi, wh)));
		brdf::value_type G = gaf(wh, wi, wo);
		brdf::value_type D = ndf(wh);

		return ((Kd + Ks * (F * D * G) / (wi.z * wo.z)) / m_pi());
	}

	return zero_value();
}